

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

string * inja::htmlescape(string *__return_storage_ptr__,string *data)

{
  char cVar1;
  pointer pcVar2;
  size_t pos;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (sVar3 = 0; sVar3 != data->_M_string_length; sVar3 = sVar3 + 1) {
    pcVar2 = (data->_M_dataplus)._M_p;
    cVar1 = pcVar2[sVar3];
    if ((((cVar1 == '\"') || (cVar1 == '>')) || (cVar1 == '\'')) ||
       ((cVar1 == '<' || (cVar1 == '&')))) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(pcVar2 + sVar3));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string htmlescape(const std::string& data) {
  std::string buffer;
  buffer.reserve((unsigned int)(1.1 * data.size()));
  for (size_t pos = 0; pos != data.size(); ++pos) {
    switch (data[pos]) {
      case '&':  buffer.append("&amp;");       break;
      case '\"': buffer.append("&quot;");      break;
      case '\'': buffer.append("&apos;");      break;
      case '<':  buffer.append("&lt;");        break;
      case '>':  buffer.append("&gt;");        break;
      default:   buffer.append(&data[pos], 1); break;
    }
  }
  return buffer;
}